

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O3

void EOPLL_calcStereo(EOPLL *opll,int32_t *out)

{
  int32_t **ppiVar1;
  int32_t *piVar2;
  int iVar3;
  int32_t iVar4;
  long lVar5;
  byte bVar6;
  int iVar7;
  EOPLL_RateConv *conv;
  double dVar8;
  double dVar9;
  
  dVar9 = opll->out_step;
  dVar8 = opll->out_time;
  if (dVar9 <= dVar8) {
    conv = opll->conv;
  }
  else {
    do {
      opll->out_time = dVar8 + opll->inp_step;
      update_output(opll);
      opll->mix_out[0] = 0;
      opll->mix_out[1] = 0;
      iVar3 = 0;
      lVar5 = -0xe;
      iVar7 = 0;
      do {
        bVar6 = opll->pan[lVar5 + 0xe];
        if ((bVar6 & 2) != 0) {
          iVar7 = iVar7 + ((int)*(short *)((long)opll->mix_out + lVar5 * 2) *
                           opll->pan_fine[lVar5 + 0xe][0] >> 0x10);
          opll->mix_out[0] = iVar7;
          bVar6 = opll->pan[lVar5 + 0xe];
        }
        if ((bVar6 & 1) != 0) {
          iVar3 = iVar3 + ((int)*(short *)((long)opll->mix_out + lVar5 * 2) *
                           opll->pan_fine[lVar5 + 0xe][1] >> 0x10);
          opll->mix_out[1] = iVar3;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0);
      conv = opll->conv;
      if (conv != (EOPLL_RateConv *)0x0) {
        ppiVar1 = conv->buf;
        piVar2 = *ppiVar1;
        memmove(piVar2,piVar2 + 1,0x3c);
        piVar2[0xf] = iVar7;
        iVar4 = opll->mix_out[1];
        piVar2 = ppiVar1[1];
        memmove(piVar2,piVar2 + 1,0x3c);
        piVar2[0xf] = iVar4;
      }
      dVar9 = opll->out_step;
      dVar8 = opll->out_time;
    } while (dVar8 < dVar9);
  }
  opll->out_time = dVar8 - dVar9;
  if (conv == (EOPLL_RateConv *)0x0) {
    *out = opll->mix_out[0];
    iVar4 = opll->mix_out[1];
  }
  else {
    iVar4 = EOPLL_RateConv_getData(conv,0);
    *out = iVar4;
    iVar4 = EOPLL_RateConv_getData(opll->conv,1);
  }
  out[1] = iVar4;
  return;
}

Assistant:

void EOPLL_calcStereo(EOPLL *opll, int32_t out[2]) {
  while (opll->out_step > opll->out_time) {
    opll->out_time += opll->inp_step;
    update_output(opll);
    mix_output_stereo(opll);
  }
  opll->out_time -= opll->out_step;
  if (opll->conv) {
    out[0] = EOPLL_RateConv_getData(opll->conv, 0);
    out[1] = EOPLL_RateConv_getData(opll->conv, 1);
  } else {
    out[0] = opll->mix_out[0];
    out[1] = opll->mix_out[1];
  }
}